

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

Am_Object get_selection_widget(Am_Value *v)

{
  bool bVar1;
  Am_Value *test_value;
  Am_Value *pAVar2;
  Am_Object extraout_RAX;
  Am_Object extraout_RAX_00;
  Am_Value *in_RSI;
  Am_Value_List v_list;
  Am_Value_List local_30;
  
  bVar1 = Am_Value_List::Test(in_RSI);
  if (!bVar1) {
    Am_Object::Am_Object((Am_Object *)v,in_RSI);
    return (Am_Object)extraout_RAX.data;
  }
  test_value = Am_Object::Get(&Am_Screen,499,0);
  Am_Value_List::Am_Value_List(&local_30,in_RSI);
  Am_Value_List::Start(&local_30);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_30);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_30);
    Am_Object::Am_Object((Am_Object *)v,pAVar2);
    bVar1 = Am_Object::Valid((Am_Object *)v);
    if (bVar1) {
      pAVar2 = Am_Object::Get((Am_Object *)v,0x1f1,0);
      bVar1 = Am_Value::operator==(pAVar2,test_value);
      if (bVar1) goto LAB_00238387;
    }
    Am_Object::~Am_Object((Am_Object *)v);
    Am_Value_List::Next(&local_30);
  }
  Am_Object::Am_Object((Am_Object *)v,&Am_No_Object);
LAB_00238387:
  Am_Value_List::~Am_Value_List(&local_30);
  return (Am_Object)extraout_RAX_00.data;
}

Assistant:

static Am_Object
get_selection_widget(const Am_Value v)
{
  if (!(Am_Value_List::Test(v)))
    return v;
  else {
    const Am_Value& last_user = Am_Screen.Get(Am_LAST_USER_ID);
    Am_Value_List v_list = v;
    for (v_list.Start(); !v_list.Last(); v_list.Next()) {
      Am_Object item = v_list.Get();
      if (item.Valid() && item.Get(Am_USER_ID) == last_user)
        return item;
    }
    return Am_No_Object;
  }
}